

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall
helics::EndpointInfo::addMessage
          (EndpointInfo *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  difference_type dVar1;
  _Self local_e8;
  _Self local_c8;
  _TmpBuf __buf;
  handle handle;
  _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
  local_30;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock(&handle,&this->message_queue);
  std::
  deque<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
  ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
            ((deque<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
              *)handle.data,message);
  local_e8._M_cur =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_e8._M_first =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_e8._M_last =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_e8._M_node =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  local_c8._M_cur =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_c8._M_node =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_c8._M_first =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_c8._M_last =
       ((handle.data)->
       super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  if (local_e8._M_cur != local_c8._M_cur) {
    local_30._M_cur = local_e8._M_cur;
    local_30._M_first = local_e8._M_first;
    local_30._M_last = local_e8._M_last;
    local_30._M_node = local_e8._M_node;
    dVar1 = std::operator-(&local_c8,&local_e8);
    std::
    _Temporary_buffer<std::_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
    ::_Temporary_buffer(&__buf,&local_30,(dVar1 + 1) / 2);
    if (__buf._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<std::_Deque_iterator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>&,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*>,__gnu_cxx::__ops::_Iter_comp_iter<helics::__5>>
                ();
    }
    else {
      std::
      __stable_sort_adaptive<std::_Deque_iterator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>&,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<helics::__5>>
                ();
    }
    std::
    _Temporary_buffer<std::_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
    ::~_Temporary_buffer(&__buf);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&handle.m_handle_lock);
  return;
}

Assistant:

void EndpointInfo::addMessage(std::unique_ptr<Message> message)
{
    auto handle = message_queue.lock();
    handle->push_back(std::move(message));
    std::stable_sort(handle->begin(), handle->end(), msgSorter);
}